

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPointPointShape.cpp
# Opt level: O3

void __thiscall
chrono::ChSpringShape::UpdateLineGeometry
          (ChSpringShape *this,ChVector<double> *endpoint1,ChVector<double> *endpoint2)

{
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  double dVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined8 in_XMM11_Qa;
  undefined8 in_XMM11_Qb;
  ChVector<double> Vz;
  ChVector<double> Vy;
  ChVector<double> Vx;
  ChVector<double> V2;
  ChVector<double> V1;
  ChVector<double> dir;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  ChVector<double> local_188;
  ChVector<double> local_168;
  ChVector<double> local_148;
  ChVector<double> local_128;
  ChVector<double> local_110;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  ChCoordsys<double> local_d8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ChLine local_88;
  undefined1 local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  ChVector<double> local_48;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x68);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b41c30;
  *(undefined1 *)&this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 2;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChLinePath_00b3d9e0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[2]._M_use_count = 0;
  this_00[2]._M_weak_count = 0;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[3]._M_use_count = 0;
  this_00[3]._M_weak_count = 0;
  this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[4]._M_use_count = 0;
  this_00[4]._M_weak_count = 0;
  this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[5]._M_use_count = 0;
  this_00[5]._M_weak_count = 0;
  this_00[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  dVar6 = endpoint2->m_data[1] - endpoint1->m_data[1];
  dVar18 = endpoint2->m_data[0] - endpoint1->m_data[0];
  dVar15 = endpoint2->m_data[2] - endpoint1->m_data[2];
  local_148.m_data[0] = 0.0;
  local_148.m_data[1] = 0.0;
  local_168.m_data[0] = 0.0;
  local_168.m_data[1] = 0.0;
  local_188.m_data[0] = 0.0;
  local_188.m_data[1] = 0.0;
  local_148.m_data[2] = 0.0;
  local_168.m_data[2] = 0.0;
  local_188.m_data[2] = 0.0;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar18;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar6 * dVar6;
  auVar9 = vfmadd231sd_fma(auVar19,auVar9,auVar9);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar15;
  auVar9 = vfmadd231sd_fma(auVar9,auVar17,auVar17);
  auVar9 = vsqrtsd_avx(auVar9,auVar9);
  dVar20 = auVar9._0_8_;
  bVar3 = 2.2250738585072014e-308 <= dVar20;
  dVar21 = 1.0 / dVar20;
  local_48.m_data[0] =
       (double)((ulong)bVar3 * (long)(dVar18 * dVar21) + (ulong)!bVar3 * 0x3ff0000000000000);
  local_48.m_data[1] = (double)((ulong)bVar3 * (long)(dVar6 * dVar21));
  local_48.m_data[2] = (double)((ulong)bVar3 * (long)(dVar15 * dVar21));
  XdirToDxDyDz<double>(&local_48,(ChVector<double> *)&VECT_Y,&local_148,&local_168,&local_188);
  dVar8 = local_148.m_data[2];
  dVar7 = local_148.m_data[1];
  dVar1 = local_168.m_data[2];
  dVar21 = local_168.m_data[0];
  dVar15 = local_188.m_data[1];
  dVar18 = local_188.m_data[0];
  dVar6 = local_148.m_data[0] + local_168.m_data[1] + local_188.m_data[2];
  if (0.0 <= dVar6) {
    dVar6 = dVar6 + 1.0;
    if (dVar6 < 0.0) {
      local_d8.rot.m_data[3] = sqrt(dVar6);
    }
    else {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar6;
      auVar9 = vsqrtsd_avx(auVar11,auVar11);
      local_d8.rot.m_data[3] = auVar9._0_8_;
    }
    local_d8.rot.m_data[0] = local_d8.rot.m_data[3] * 0.5;
    local_d8.rot.m_data[3] = 0.5 / local_d8.rot.m_data[3];
    local_d8.rot.m_data[1] = (dVar1 - dVar15) * local_d8.rot.m_data[3];
    local_d8.rot.m_data[2] = (dVar18 - dVar8) * local_d8.rot.m_data[3];
    local_d8.rot.m_data[3] = (dVar7 - dVar21) * local_d8.rot.m_data[3];
    goto LAB_0082640f;
  }
  if (local_168.m_data[1] <= local_148.m_data[0]) {
    if (local_148.m_data[0] < local_188.m_data[2]) goto LAB_008261eb;
    dVar6 = ((local_148.m_data[0] - local_168.m_data[1]) - local_188.m_data[2]) + 1.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar6;
      auVar9 = vsqrtsd_avx(auVar13,auVar13);
      dVar6 = auVar9._0_8_;
    }
    local_d8.rot.m_data[0] = dVar1 - dVar15;
    local_d8.rot.m_data[1] = dVar6 * 0.5;
    dVar6 = 0.5 / dVar6;
    local_d8.rot.m_data[2] = (dVar21 + dVar7) * dVar6;
    local_d8.rot.m_data[3] = (dVar8 + dVar18) * dVar6;
  }
  else if (local_168.m_data[1] < local_188.m_data[2]) {
LAB_008261eb:
    dVar6 = ((local_188.m_data[2] - local_148.m_data[0]) - local_168.m_data[1]) + 1.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar6;
      auVar9 = vsqrtsd_avx(auVar12,auVar12);
      dVar6 = auVar9._0_8_;
    }
    local_d8.rot.m_data[0] = dVar7 - dVar21;
    local_d8.rot.m_data[3] = dVar6 * 0.5;
    dVar6 = 0.5 / dVar6;
    local_d8.rot.m_data[1] = (dVar8 + dVar18) * dVar6;
    local_d8.rot.m_data[2] = (dVar15 + dVar1) * dVar6;
  }
  else {
    dVar6 = ((local_168.m_data[1] - local_188.m_data[2]) - local_148.m_data[0]) + 1.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar6;
      auVar9 = vsqrtsd_avx(auVar10,auVar10);
      dVar6 = auVar9._0_8_;
    }
    local_d8.rot.m_data[0] = dVar18 - dVar8;
    local_d8.rot.m_data[2] = dVar6 * 0.5;
    dVar6 = 0.5 / dVar6;
    local_d8.rot.m_data[3] = (dVar15 + dVar1) * dVar6;
    local_d8.rot.m_data[1] = (dVar21 + dVar7) * dVar6;
  }
  local_d8.rot.m_data[0] = local_d8.rot.m_data[0] * dVar6;
LAB_0082640f:
  local_d8.pos.m_data[0] = endpoint1->m_data[0];
  local_d8.pos.m_data[1] = endpoint1->m_data[1];
  local_d8.pos.m_data[2] = endpoint1->m_data[2];
  uVar4 = this->resolution;
  if (uVar4 != 0) {
    uVar5 = 0;
    dVar6 = 0.0;
    dVar18 = 0.0;
    do {
      dVar15 = (double)((int)uVar5 + 1);
      auVar2._8_8_ = in_XMM11_Qb;
      auVar2._0_8_ = in_XMM11_Qa;
      auVar9 = vcvtusi2sd_avx512f(auVar2,uVar4);
      dVar7 = (this->turns * 6.283185307179586 * dVar15) / auVar9._0_8_;
      dVar1 = (dVar15 / auVar9._0_8_) * dVar20;
      dVar15 = this->radius;
      dVar8 = cos(dVar18);
      dVar21 = this->radius;
      local_110.m_data[2] = sin(dVar18);
      local_110.m_data[2] = local_110.m_data[2] * dVar21;
      dVar18 = this->radius;
      local_110.m_data[0] = dVar6;
      local_110.m_data[1] = dVar8 * dVar15;
      dVar15 = cos(dVar7);
      dVar6 = this->radius;
      local_128.m_data[2] = sin(dVar7);
      local_128.m_data[2] = local_128.m_data[2] * dVar6;
      local_128.m_data[0] = dVar1;
      local_128.m_data[1] = dVar15 * dVar18;
      ChCoordsys<double>::TransformLocalToParent(&local_d8,&local_110);
      ChCoordsys<double>::TransformLocalToParent(&local_d8,&local_128);
      auVar14._8_8_ = local_e8;
      auVar14._0_8_ = local_e8;
      auVar14._16_8_ = local_e8;
      auVar14._24_8_ = local_e8;
      local_88.closed = false;
      local_88.complexityU = 2;
      local_88.super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_00b3d8b8;
      auVar14 = vblendpd_avx(ZEXT1632(local_f8),auVar14,4);
      auVar16._8_8_ = local_a0;
      auVar16._0_8_ = local_a0;
      auVar16._16_8_ = local_a0;
      auVar16._24_8_ = local_a0;
      local_78 = vblendpd_avx(auVar14,auVar16,8);
      local_58 = local_98;
      uStack_50 = uStack_90;
      geometry::ChLinePath::AddSubLine((ChLinePath *)(this_00 + 1),&local_88,1.0);
      uVar4 = this->resolution;
      uVar5 = uVar5 + 1;
      dVar6 = dVar1;
      dVar18 = dVar7;
    } while (uVar5 < uVar4);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  (this->super_ChPointPointShape).super_ChLineShape.gline.
  super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_00 + 1);
  local_190._M_pi = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChPointPointShape).super_ChLineShape.gline.
              super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_190);
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void ChSpringShape::UpdateLineGeometry(const ChVector<>& endpoint1, const ChVector<>& endpoint2) {
    auto linepath = chrono_types::make_shared<geometry::ChLinePath>();

    // Following part was copied from irrlicht::tools::drawSpring()
    ChVector<> dist = endpoint2 - endpoint1;
    ChVector<> Vx, Vy, Vz;
    double length = dist.Length();
    ChVector<> dir = dist.GetNormalized();
    XdirToDxDyDz(dir, VECT_Y, Vx, Vy, Vz);

    ChMatrix33<> rel_matrix(Vx, Vy, Vz);
    ChCoordsys<> mpos(endpoint1, rel_matrix.Get_A_quaternion());

    double phaseA = 0;
    double phaseB = 0;
    double heightA = 0;
    double heightB = 0;

    for (int iu = 1; iu <= resolution; iu++) {
        phaseB = turns * CH_C_2PI * (double)iu / (double)resolution;
        heightB = length * ((double)iu / (double)resolution);
        ChVector<> V1(heightA, radius * cos(phaseA), radius * sin(phaseA));
        ChVector<> V2(heightB, radius * cos(phaseB), radius * sin(phaseB));

        auto segment = geometry::ChLineSegment(mpos.TransformLocalToParent(V1), mpos.TransformLocalToParent(V2));
        linepath->AddSubLine(segment);
        phaseA = phaseB;
        heightA = heightB;
    }

    this->SetLineGeometry(std::static_pointer_cast<geometry::ChLine>(linepath));
}